

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O3

int hdr_decode_compressed(uint8_t *buffer,size_t length,hdr_histogram **histogram)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint *puVar6;
  uint counts_limit;
  size_t __size;
  uint uVar7;
  hdr_histogram *h;
  encoding_flyweight_v0_t encoding_flyweight;
  hdr_histogram *local_e0;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint uStack_c8;
  ulong local_c4;
  ulong local_bc;
  ulong local_b4;
  uint8_t *local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  uint *puStack_90;
  uint local_88;
  undefined4 uStack_84;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (length < 8) {
    return 0x16;
  }
  uVar2 = *(uint *)buffer;
  uVar2 = (uVar2 & 0xfffffff) >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
          (uVar2 & 0xfffffff) << 0x18;
  if (uVar2 == 0x1c849302) {
    local_e0 = (hdr_histogram *)0x0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_84 = 0;
    uStack_80 = 0;
    local_98 = 0;
    puStack_90 = (uint *)0x0;
    local_a8 = (uint8_t *)0x0;
    uStack_a0 = 0;
    iVar3 = inflateInit_(&local_a8,"1.2.11",0x70);
    iVar4 = -0x752a;
    iVar5 = -0x752a;
    if (iVar3 == 0) {
      uVar2 = *(uint *)(buffer + 4);
      uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      if (length - 8 < (ulong)uVar2 || (int)uVar2 < 0) {
        iVar5 = 0x16;
        goto LAB_00105502;
      }
      local_a8 = buffer + 8;
      uStack_a0 = CONCAT44(uStack_a0._4_4_,uVar2);
      puStack_90 = &local_d4;
      local_88 = 0x28;
      iVar3 = inflate(&local_a8,2);
      if (iVar3 != 0) goto LAB_00105502;
      if ((local_d4 >> 0x18 & 0xffffff0f | (local_d4 & 0xff0000) >> 8 | (local_d4 & 0xff00) << 8 |
          local_d4 << 0x18) != 0x1c849301) {
        iVar5 = -0x752e;
        goto LAB_00105502;
      }
      uVar2 = local_d4 >> 0x1c;
      if (uVar2 == 0) {
        iVar5 = -0x7525;
        goto LAB_00105502;
      }
      counts_limit = (local_d0 >> 0x18 | (local_d0 & 0xff0000) >> 8 | (local_d0 & 0xff00) << 8 |
                     local_d0 << 0x18) / uVar2;
      iVar5 = hdr_init(local_c4 >> 0x38 | (local_c4 & 0xff000000000000) >> 0x28 |
                       (local_c4 & 0xff0000000000) >> 0x18 | (local_c4 & 0xff00000000) >> 8 |
                       (local_c4 & 0xff000000) << 8 | (local_c4 & 0xff0000) << 0x18 |
                       (local_c4 & 0xff00) << 0x28 | local_c4 << 0x38,
                       local_bc >> 0x38 | (local_bc & 0xff000000000000) >> 0x28 |
                       (local_bc & 0xff0000000000) >> 0x18 | (local_bc & 0xff00000000) >> 8 |
                       (local_bc & 0xff000000) << 8 | (local_bc & 0xff0000) << 0x18 |
                       (local_bc & 0xff00) << 0x28 | local_bc << 0x38,
                       uStack_c8 >> 0x18 | (uStack_c8 & 0xff0000) >> 8 | (uStack_c8 & 0xff00) << 8 |
                       uStack_c8 << 0x18,&local_e0);
      if (iVar5 == 0) {
        uVar7 = counts_limit * uVar2;
        puVar6 = (uint *)calloc(1,(long)(int)uVar7);
        if (puVar6 == (uint *)0x0) goto LAB_0010543f;
        puStack_90 = puVar6;
        local_88 = uVar7;
        iVar5 = inflate(&local_a8,4);
        bVar1 = false;
        if (iVar5 == 1) {
          apply_to_counts(local_e0,uVar2,(uint8_t *)puVar6,counts_limit);
          local_e0->normalizing_index_offset =
               local_cc >> 0x18 | (local_cc & 0xff0000) >> 8 | (local_cc & 0xff00) << 8 |
               local_cc << 0x18;
          local_e0->conversion_ratio =
               (double)(local_b4 >> 0x38 | (local_b4 & 0xff000000000000) >> 0x28 |
                        (local_b4 & 0xff0000000000) >> 0x18 | (local_b4 & 0xff00000000) >> 8 |
                        (local_b4 & 0xff000000) << 8 | (local_b4 & 0xff0000) << 0x18 |
                        (local_b4 & 0xff00) << 0x28 | local_b4 << 0x38);
          hdr_reset_internal_counters(local_e0);
          bVar1 = true;
          iVar4 = 0;
        }
      }
      else {
LAB_0010543f:
        puVar6 = (uint *)0x0;
        bVar1 = false;
        iVar4 = 0xc;
      }
    }
    else {
LAB_00105502:
      iVar4 = iVar5;
      puVar6 = (uint *)0x0;
      bVar1 = false;
    }
    inflateEnd(&local_a8);
    free(puVar6);
  }
  else {
    if (uVar2 == 0x1c849304) {
      local_e0 = (hdr_histogram *)0x0;
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_84 = 0;
      uStack_80 = 0;
      local_98 = 0;
      puStack_90 = (uint *)0x0;
      local_a8 = (uint8_t *)0x0;
      uStack_a0 = 0;
      iVar5 = inflateInit_(&local_a8,"1.2.11",0x70);
      iVar4 = -0x752a;
      if (iVar5 == 0) {
        uVar2 = *(uint *)(buffer + 4);
        uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        if (length - 8 < (ulong)uVar2 || (int)uVar2 < 0) {
          iVar4 = 0x16;
          goto LAB_001054d5;
        }
        local_a8 = buffer + 8;
        uStack_a0 = CONCAT44(uStack_a0._4_4_,uVar2);
        puStack_90 = &local_d4;
        local_88 = 0x28;
        iVar5 = inflate(&local_a8,2);
        if (iVar5 != 0) goto LAB_001054d5;
        if ((local_d4 & 0xfffffff) != 0x393841c) {
          iVar4 = -0x752e;
          goto LAB_001054d5;
        }
        iVar4 = hdr_init(local_c4 >> 0x38 | (local_c4 & 0xff000000000000) >> 0x28 |
                         (local_c4 & 0xff0000000000) >> 0x18 | (local_c4 & 0xff00000000) >> 8 |
                         (local_c4 & 0xff000000) << 8 | (local_c4 & 0xff0000) << 0x18 |
                         (local_c4 & 0xff00) << 0x28 | local_c4 << 0x38,
                         local_bc >> 0x38 | (local_bc & 0xff000000000000) >> 0x28 |
                         (local_bc & 0xff0000000000) >> 0x18 | (local_bc & 0xff00000000) >> 8 |
                         (local_bc & 0xff000000) << 8 | (local_bc & 0xff0000) << 0x18 |
                         (local_bc & 0xff00) << 0x28 | local_bc << 0x38,
                         uStack_c8 >> 0x18 | (uStack_c8 & 0xff0000) >> 8 | (uStack_c8 & 0xff00) << 8
                         | uStack_c8 << 0x18,&local_e0);
        if (iVar4 == 0) {
          uVar2 = local_d0 >> 0x18 | (local_d0 & 0xff0000) >> 8 | (local_d0 & 0xff00) << 8 |
                  local_d0 << 0x18;
          puVar6 = (uint *)calloc(1,(long)(int)uVar2 + 9);
          if (puVar6 == (uint *)0x0) {
            iVar4 = 0xc;
            goto LAB_001054d5;
          }
          puStack_90 = puVar6;
          local_88 = uVar2;
          iVar5 = inflate(&local_a8,4);
          iVar4 = -0x752a;
          if ((iVar5 == 1) &&
             (iVar4 = apply_to_counts_zz(local_e0,(uint8_t *)puVar6,uVar2), iVar4 == 0)) {
            local_e0->normalizing_index_offset =
                 local_cc >> 0x18 | (local_cc & 0xff0000) >> 8 | (local_cc & 0xff00) << 8 |
                 local_cc << 0x18;
            local_e0->conversion_ratio =
                 (double)(local_b4 >> 0x38 | (local_b4 & 0xff000000000000) >> 0x28 |
                          (local_b4 & 0xff0000000000) >> 0x18 | (local_b4 & 0xff00000000) >> 8 |
                          (local_b4 & 0xff000000) << 8 | (local_b4 & 0xff0000) << 0x18 |
                          (local_b4 & 0xff00) << 0x28 | local_b4 << 0x38);
            hdr_reset_internal_counters(local_e0);
            iVar4 = 0;
          }
        }
        else {
          puVar6 = (uint *)0x0;
        }
      }
      else {
LAB_001054d5:
        puVar6 = (uint *)0x0;
      }
      inflateEnd(&local_a8);
      free(puVar6);
      if (iVar4 != 0) goto LAB_001054ee;
      goto LAB_0010551c;
    }
    if (uVar2 != 0x1c849309) {
      return -29999;
    }
    local_e0 = (hdr_histogram *)0x0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_84 = 0;
    uStack_80 = 0;
    local_98 = 0;
    puStack_90 = (uint *)0x0;
    local_a8 = (uint8_t *)0x0;
    uStack_a0 = 0;
    iVar3 = inflateInit_(&local_a8,"1.2.11",0x70);
    iVar4 = -0x752a;
    iVar5 = -0x752a;
    if (iVar3 == 0) {
      uVar2 = *(uint *)(buffer + 4);
      uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      if (length - 8 < (ulong)uVar2 || (int)uVar2 < 0) {
        iVar5 = 0x16;
        goto LAB_00105556;
      }
      local_a8 = buffer + 8;
      uStack_a0 = CONCAT44(uStack_a0._4_4_,uVar2);
      puStack_90 = &local_d4;
      local_88 = 0x20;
      iVar3 = inflate(&local_a8,2);
      if (iVar3 != 0) goto LAB_00105556;
      if ((local_d4 >> 0x18 & 0xffffff0f | (local_d4 & 0xff0000) >> 8 | (local_d4 & 0xff00) << 8 |
          local_d4 << 0x18) != 0x1c849308) {
        iVar5 = -0x752e;
        goto LAB_00105556;
      }
      iVar5 = hdr_init((ulong)(uStack_c8 >> 0x18) | (((ulong)uStack_c8 & 0xff0000) << 0x20) >> 0x28
                       | (((ulong)uStack_c8 & 0xff00) << 0x20) >> 0x18 |
                       (((ulong)uStack_c8 & 0xff) << 0x20) >> 8 |
                       ((ulong)local_cc & 0xff000000) << 8 | ((ulong)local_cc & 0xff0000) << 0x18 |
                       ((ulong)local_cc & 0xff00) << 0x28 | CONCAT44(uStack_c8,local_cc) << 0x38,
                       local_c4 >> 0x38 | (local_c4 & 0xff000000000000) >> 0x28 |
                       (local_c4 & 0xff0000000000) >> 0x18 | (local_c4 & 0xff00000000) >> 8 |
                       (local_c4 & 0xff000000) << 8 | (local_c4 & 0xff0000) << 0x18 |
                       (local_c4 & 0xff00) << 0x28 | local_c4 << 0x38,
                       local_d0 >> 0x18 | (local_d0 & 0xff0000) >> 8 | (local_d0 & 0xff00) << 8 |
                       local_d0 << 0x18,&local_e0);
      if (iVar5 == 0) {
        __size = (long)local_e0->counts_len * (ulong)(local_d4 >> 0x1c);
        puVar6 = (uint *)calloc(1,__size);
        if (puVar6 == (uint *)0x0) goto LAB_001054c0;
        local_88 = (uint)__size;
        puStack_90 = puVar6;
        iVar5 = inflate(&local_a8,4);
        bVar1 = false;
        if (iVar5 == 1) {
          apply_to_counts(local_e0,local_d4 >> 0x1c,(uint8_t *)puVar6,local_e0->counts_len);
          hdr_reset_internal_counters(local_e0);
          local_e0->normalizing_index_offset = 0;
          local_e0->conversion_ratio = 1.0;
          bVar1 = true;
          iVar4 = 0;
        }
      }
      else {
LAB_001054c0:
        puVar6 = (uint *)0x0;
        bVar1 = false;
        iVar4 = 0xc;
      }
    }
    else {
LAB_00105556:
      iVar4 = iVar5;
      puVar6 = (uint *)0x0;
      bVar1 = false;
    }
    inflateEnd(&local_a8);
    free(puVar6);
  }
  if (!bVar1) {
LAB_001054ee:
    hdr_close(local_e0);
    return iVar4;
  }
LAB_0010551c:
  if (*histogram == (hdr_histogram *)0x0) {
    *histogram = local_e0;
  }
  else {
    hdr_add(*histogram,local_e0);
    free(local_e0);
  }
  return iVar4;
}

Assistant:

int hdr_decode_compressed(
    uint8_t* buffer, size_t length, struct hdr_histogram** histogram)
{
    uint32_t compression_cookie;
    compression_flyweight_t* compression_flyweight;

    if (length < SIZEOF_COMPRESSION_FLYWEIGHT)
    {
        return EINVAL;
    }

    compression_flyweight = (compression_flyweight_t*) buffer;

    compression_cookie = get_cookie_base(be32toh(compression_flyweight->cookie));
    if (V0_COMPRESSION_COOKIE == compression_cookie)
    {
        return hdr_decode_compressed_v0(compression_flyweight, length, histogram);
    }
    else if (V1_COMPRESSION_COOKIE == compression_cookie)
    {
        return hdr_decode_compressed_v1(compression_flyweight, length, histogram);
    }
    else if (V2_COMPRESSION_COOKIE == compression_cookie)
    {
        return hdr_decode_compressed_v2(compression_flyweight, length, histogram);
    }

    return HDR_COMPRESSION_COOKIE_MISMATCH;
}